

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O1

bool __thiscall
dap::json::JsonCppSerializer::array
          (JsonCppSerializer *this,size_t count,function<bool_(dap::Serializer_*)> *cb)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  JsonCppSerializer s;
  Value *local_60;
  undefined1 local_58 [16];
  undefined2 local_48;
  
  Json::Value::Value((Value *)local_58,arrayValue);
  Json::Value::operator=(this->json,(Value *)local_58);
  Json::Value::~Value((Value *)local_58);
  bVar3 = count == 0;
  if (!bVar3) {
    uVar2 = 0;
    do {
      local_58._8_8_ = Json::Value::operator[](this->json,(ArrayIndex)uVar2);
      local_58._0_8_ = &PTR__JsonCppSerializer_00a3c708;
      local_48 = 0;
      local_60 = (Value *)local_58;
      if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar1 = (*cb->_M_invoker)((_Any_data *)cb,(Serializer **)&local_60);
      ~JsonCppSerializer((JsonCppSerializer *)local_58);
      if (!bVar1) {
        return bVar3;
      }
      uVar2 = uVar2 + 1;
      bVar3 = count <= uVar2;
    } while (uVar2 != count);
  }
  return bVar3;
}

Assistant:

bool JsonCppSerializer::array(size_t count,
                              const std::function<bool(dap::Serializer*)>& cb) {
  *json = Json::Value(Json::arrayValue);
  for (size_t i = 0; i < count; i++) {
    JsonCppSerializer s(&(*json)[Json::Value::ArrayIndex(i)]);
    if (!cb(&s)) {
      return false;
    }
  }
  return true;
}